

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal.hpp
# Opt level: O3

double duckdb::TryCastDecimalCInternal<double>(duckdb_result *source,idx_t col,idx_t row)

{
  bool bVar1;
  double in_RAX;
  double dVar2;
  double result_value;
  double local_8;
  
  local_8 = in_RAX;
  bVar1 = CastDecimalCInternal<double>(source,&local_8,col,row);
  dVar2 = 0.0;
  if (bVar1) {
    dVar2 = local_8;
  }
  return dVar2;
}

Assistant:

RESULT_TYPE TryCastDecimalCInternal(duckdb_result *source, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!CastDecimalCInternal<RESULT_TYPE>(source, result_value, col, row)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}